

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O3

int format_octal(int64_t v,char *p,int s)

{
  ulong __n;
  uint uVar1;
  int iVar2;
  char *__s;
  ulong uVar3;
  
  __n = (ulong)(uint)s;
  if (v < 0) {
    iVar2 = -1;
    if (0 < s) {
      memset(p,0x30,__n);
    }
  }
  else if (s < 1) {
    iVar2 = -(uint)(v != 0);
  }
  else {
    __s = p + __n;
    uVar1 = s + 1;
    do {
      uVar3 = v;
      __s[-1] = (byte)uVar3 & 7 | 0x30;
      __s = __s + -1;
      uVar1 = uVar1 - 1;
      v = uVar3 >> 3;
    } while (1 < uVar1);
    iVar2 = (uVar3 < 8) - 1;
    if (uVar3 >= 8 && 0 < s) {
      memset(__s,0x37,__n);
      iVar2 = -1;
    }
  }
  return iVar2;
}

Assistant:

static int
format_octal(int64_t v, char *p, int s)
{
	int len;
	char *h;

	len = s;
	h = p;

	/* Octal values can't be negative, so use 0. */
	if (v < 0) {
		while (len-- > 0)
			*p++ = '0';
		return (-1);
	}

	p += s;		/* Start at the end and work backwards. */
	do {
		*--p = (char)('0' + (v & 7));
		v >>= 3;
	} while (--s > 0 && v > 0);

	if (v == 0) {
		memmove(h, p, len - s);
		p = h + len - s;
		while (s-- > 0)
			*p++ = ' ';
		return (0);
	}
	/* If it overflowed, fill field with max value. */
	while (len-- > 0)
		*p++ = '7';

	return (-1);
}